

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::compareExpr(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  InfixExprNode *this_00;
  ExprNode **ppEVar3;
  ExprNode *pEVar4;
  Token local_1f8;
  undefined1 local_181;
  Token local_180;
  InfixExprNode *local_110;
  InfixExprNode *p;
  Token op;
  undefined1 local_88 [8];
  Token tok;
  ExprNode *left;
  Parser *this_local;
  
  tok._string.field_2._8_8_ = arithExpr(this);
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  while( true ) {
    bVar2 = Token::isComparisonOperator((Token *)local_88);
    if (!bVar2) break;
    Tokenizer::ungetToken(this->tokenizer);
    compareOp((Token *)&p,this);
    this_00 = (InfixExprNode *)operator_new(0x90);
    local_181 = 1;
    Token::Token(&local_180,(Token *)&p);
    InfixExprNode::InfixExprNode(this_00,&local_180);
    local_181 = 0;
    Token::~Token(&local_180);
    uVar1 = tok._string.field_2._8_8_;
    local_110 = this_00;
    ppEVar3 = InfixExprNode::left(this_00);
    *ppEVar3 = (ExprNode *)uVar1;
    pEVar4 = arithExpr(this);
    ppEVar3 = InfixExprNode::right(local_110);
    *ppEVar3 = pEVar4;
    tok._string.field_2._8_8_ = local_110;
    Tokenizer::getToken(&local_1f8,this->tokenizer);
    Token::operator=((Token *)local_88,&local_1f8);
    Token::~Token(&local_1f8);
    Token::~Token((Token *)&p);
  }
  Tokenizer::ungetToken(this->tokenizer);
  uVar1 = tok._string.field_2._8_8_;
  Token::~Token((Token *)local_88);
  return (ExprNode *)uVar1;
}

Assistant:

ExprNode *Parser::compareExpr() {

    // comparison: arith_expr {comp_op arith_expr}*

    ExprNode *left = arithExpr();
    Token tok = tokenizer.getToken();
    while (tok.isComparisonOperator()) {
        tokenizer.ungetToken();
        Token op = compareOp();
        auto *p = new InfixExprNode(op);
        p->left() = left;
        p->right() = arithExpr();
        left = p;
        tok = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return left;
}